

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O2

void printRep(myRep *rep,int len)

{
  char *pcVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  int iVar4;
  int iVar5;
  int i;
  long lVar6;
  ofstream outFile;
  
  pcVar1 = catStrIntStr("/home/ws/zzZyj/data/rep/rep",1,".txt");
  std::ofstream::ofstream((ostream *)&outFile,pcVar1,_S_out);
  iVar5 = 0;
  p_Var3 = (_List_node_base *)rep;
  while (p_Var3 = (((_List_base<Rep,_std::allocator<Rep>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next, p_Var3 != (_List_node_base *)rep) {
    iVar5 = iVar5 + 1;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&outFile,iVar5);
    std::operator<<(poVar2," cost[0]=");
    poVar2 = std::ostream::_M_insert<double>(*(double *)p_Var3[1]._M_next);
    std::operator<<(poVar2," cost[1]=");
    poVar2 = std::ostream::_M_insert<double>(*(double *)((long)p_Var3[1]._M_next + 8));
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&outFile,"Following is the x,y,z coordinary: ");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar4 = 1;
    for (lVar6 = 0; lVar6 < len; lVar6 = lVar6 + 3) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&outFile,iVar4);
      std::operator<<(poVar2," ");
      poVar2 = std::ostream::_M_insert<double>((double)(&(p_Var3[1]._M_prev)->_M_next)[lVar6]);
      std::operator<<(poVar2," ");
      poVar2 = std::ostream::_M_insert<double>((double)(&(p_Var3[1]._M_prev)->_M_prev)[lVar6]);
      std::operator<<(poVar2," ");
      poVar2 = std::ostream::_M_insert<double>((double)(&p_Var3[1]._M_prev[1]._M_next)[lVar6]);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar4 = iVar4 + 1;
    }
    poVar2 = std::operator<<((ostream *)&outFile,
                             "------------------------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  operator_delete(pcVar1);
  std::ofstream::close();
  std::ofstream::~ofstream(&outFile);
  return;
}

Assistant:

void printRep(myRep & rep, int len){
    int repNum=0;
    repNum++;
    char *filename;
    filename = catStrIntStr("/home/ws/zzZyj/data/rep/rep", repNum, ".txt");
    ofstream outFile(filename);
    myRep ::iterator it2;
    int rr=0;
    for (it2=rep.begin(); it2!= rep.end(); it2++){
        rr++;
        outFile <<  rr << " cost[0]=" << it2->Cost[0] << " cost[1]=" << it2->Cost[1] << endl;
        outFile << "Following is the x,y,z coordinary: "<< endl;
        for (int i=0; i<len; i+=3){
            outFile<< i/3+1 << " " << it2->addO_origin[i] << " " << it2->addO_origin[i+1] << " " << it2->addO_origin[i+2]<< endl;
        }
        outFile << "------------------------------------------------------------------"<< endl;
    }
    delete filename;
    outFile.close();
}